

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.hpp
# Opt level: O2

bool __thiscall
sphere<double>::is_hit
          (sphere<double> *this,ray<double> *r,double *t_min,double *t_max,hit_rec<double> *rec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  vec3<double> n_out;
  point3<double> local_48;
  
  dVar2 = (r->o_).e[0] - (this->c_).e[0];
  dVar5 = (r->o_).e[1] - (this->c_).e[1];
  dVar3 = (r->o_).e[2] - (this->c_).e[2];
  dVar4 = (r->dir_).e[0];
  dVar7 = (r->dir_).e[1];
  dVar1 = (r->dir_).e[2];
  dVar6 = dVar1 * dVar1 + dVar4 * dVar4 + dVar7 * dVar7;
  dVar7 = dVar2 * dVar4 + dVar5 * dVar7 + dVar3 * dVar1;
  dVar4 = dVar7 * dVar7 -
          ((dVar3 * dVar3 + dVar2 * dVar2 + dVar5 * dVar5) - this->r_ * this->r_) * dVar6;
  if (dVar4 < 0.0) {
    return false;
  }
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar1 = (-dVar7 - dVar4) / dVar6;
  if ((dVar1 < *t_min) || (*t_max < dVar1)) {
    dVar1 = (dVar4 - dVar7) / dVar6;
    if (dVar1 < *t_min) {
      return false;
    }
    if (*t_max < dVar1) {
      return false;
    }
  }
  rec->t = dVar1;
  ray<double>::at(&local_48,r,dVar1);
  (rec->p).e[2] = local_48.e[2];
  (rec->p).e[0] = local_48.e[0];
  (rec->p).e[1] = local_48.e[1];
  local_48.e[1] = 1.0 / this->r_;
  local_48.e[2] = ((rec->p).e[2] - (this->c_).e[2]) * local_48.e[1];
  local_48.e[0] = local_48.e[1] * ((rec->p).e[0] - (this->c_).e[0]);
  local_48.e[1] = local_48.e[1] * ((rec->p).e[1] - (this->c_).e[1]);
  hit_rec<double>::set_face(rec,r,&local_48);
  std::__shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(rec->mat).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>,
             &(this->mat).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>);
  get_sph_uv(&local_48,&rec->u,&rec->v);
  return true;
}

Assistant:

point3<T> origin() const { return o_; }